

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# bignum.c
# Opt level: O0

int mbedtls_mpi_safe_cond_swap(mbedtls_mpi *X,mbedtls_mpi *Y,uchar swap)

{
  int iVar1;
  mbedtls_mpi_uint mVar2;
  int iVar3;
  mbedtls_mpi_uint tmp;
  size_t i;
  int local_28;
  int s;
  int ret;
  uchar swap_local;
  mbedtls_mpi *Y_local;
  mbedtls_mpi *X_local;
  
  if (X == Y) {
    X_local._4_4_ = 0;
  }
  else {
    iVar3 = (int)((uint)swap | -(uint)swap & 0xff) >> 7;
    local_28 = mbedtls_mpi_grow(X,Y->n);
    if ((local_28 == 0) && (local_28 = mbedtls_mpi_grow(Y,X->n), local_28 == 0)) {
      iVar1 = X->s;
      X->s = X->s * (1 - iVar3) + Y->s * iVar3;
      Y->s = Y->s * (1 - iVar3) + iVar1 * iVar3;
      for (tmp = 0; tmp < X->n; tmp = tmp + 1) {
        mVar2 = X->p[tmp];
        X->p[tmp] = X->p[tmp] * (long)(1 - iVar3) + Y->p[tmp] * (ulong)(byte)iVar3;
        Y->p[tmp] = Y->p[tmp] * (long)(1 - iVar3) + mVar2 * (byte)iVar3;
      }
    }
    X_local._4_4_ = local_28;
  }
  return X_local._4_4_;
}

Assistant:

int mbedtls_mpi_safe_cond_swap( mbedtls_mpi *X, mbedtls_mpi *Y, unsigned char swap )
{
    int ret, s;
    size_t i;
    mbedtls_mpi_uint tmp;

    if( X == Y )
        return( 0 );

    /* make sure swap is 0 or 1 in a time-constant manner */
    swap = (swap | (unsigned char)-swap) >> 7;

    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( X, Y->n ) );
    MBEDTLS_MPI_CHK( mbedtls_mpi_grow( Y, X->n ) );

    s = X->s;
    X->s = X->s * ( 1 - swap ) + Y->s * swap;
    Y->s = Y->s * ( 1 - swap ) +    s * swap;


    for( i = 0; i < X->n; i++ )
    {
        tmp = X->p[i];
        X->p[i] = X->p[i] * ( 1 - swap ) + Y->p[i] * swap;
        Y->p[i] = Y->p[i] * ( 1 - swap ) +     tmp * swap;
    }

cleanup:
    return( ret );
}